

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

void Vec_IntTwoSplit(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vArr,Vec_Int_t *vArr1n,
                    Vec_Int_t *vArr2n)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *pEnd2;
  int *pEnd1;
  int *pBeg2;
  int *pBeg1;
  Vec_Int_t *vArr2n_local;
  Vec_Int_t *vArr1n_local;
  Vec_Int_t *vArr_local;
  Vec_Int_t *vArr2_local;
  Vec_Int_t *vArr1_local;
  
  piVar3 = vArr1->pArray;
  iVar1 = vArr1->nSize;
  piVar4 = vArr2->pArray;
  iVar2 = vArr2->nSize;
  pEnd1 = vArr2->pArray;
  pBeg2 = vArr1->pArray;
  while (pBeg2 < piVar3 + iVar1 && pEnd1 < piVar4 + iVar2) {
    if (*pBeg2 == *pEnd1) {
      Vec_IntPush(vArr,*pBeg2);
      pEnd1 = pEnd1 + 1;
      pBeg2 = pBeg2 + 1;
    }
    else if (*pBeg2 < *pEnd1) {
      Vec_IntPush(vArr1n,*pBeg2);
      pBeg2 = pBeg2 + 1;
    }
    else {
      Vec_IntPush(vArr2n,*pEnd1);
      pEnd1 = pEnd1 + 1;
    }
  }
  while (pBeg2 < piVar3 + iVar1) {
    Vec_IntPush(vArr1n,*pBeg2);
    pBeg2 = pBeg2 + 1;
  }
  while (pEnd1 < piVar4 + iVar2) {
    Vec_IntPush(vArr2n,*pEnd1);
    pEnd1 = pEnd1 + 1;
  }
  return;
}

Assistant:

static inline void Vec_IntTwoSplit( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vArr, Vec_Int_t * vArr1n, Vec_Int_t * vArr2n )
{
    int * pBeg1 = vArr1->pArray;
    int * pBeg2 = vArr2->pArray;
    int * pEnd1 = vArr1->pArray + vArr1->nSize;
    int * pEnd2 = vArr2->pArray + vArr2->nSize;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            Vec_IntPush( vArr, *pBeg1++ ), pBeg2++;
        else if ( *pBeg1 < *pBeg2 )
            Vec_IntPush( vArr1n, *pBeg1++ );
        else 
            Vec_IntPush( vArr2n, *pBeg2++ );
    }
    while ( pBeg1 < pEnd1 )
        Vec_IntPush( vArr1n, *pBeg1++ );
    while ( pBeg2 < pEnd2 )
        Vec_IntPush( vArr2n, *pBeg2++ );
}